

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * __thiscall
FastPForLib::__fastpackwithoutmask8_32(FastPForLib *this,uint32_t *in,uint32_t *out)

{
  uint32_t *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
  vpmovsxbd_avx2(ZEXT816(0x7c6c5c4c3c2c1c0c));
  puVar1 = in + 8;
  auVar2 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)puVar1));
  vpmovsxbd_avx2(ZEXT816(0x7464544434241404));
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)this);
  auVar4 = vpslld_avx2(auVar3,0x18);
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)puVar1));
  auVar3 = vpslld_avx2(auVar3,8);
  auVar2 = vpor_avx2(auVar3,auVar2);
  vpmovsxbd_avx2(ZEXT816(0x7868584838281808));
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)out));
  auVar3 = vpslld_avx2(auVar3,0x10);
  auVar2 = vpternlogd_avx512vl(auVar4,auVar3,auVar2,0xfe);
  *(undefined1 (*) [32])in = auVar2;
  return puVar1;
}

Assistant:

uint32_t *__fastpackwithoutmask8_32(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;

  return out;
}